

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Editor.cpp
# Opt level: O2

void __thiscall Editor::flipTile(Editor *this,bool acrossVertical)

{
  CursorState CVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  tuple<Command_*,_std::default_delete<Command>_> tVar8;
  int iVar9;
  uint uVar10;
  int i;
  ulong uVar11;
  int iVar12;
  SubBoard *this_00;
  pair<sf::Vector2<int>,_sf::Vector2<int>_> pVar13;
  Tile tile;
  bool local_a1;
  Vector2i local_a0;
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  Board *local_58;
  __uniq_ptr_impl<gui::Gui,_std::default_delete<gui::Gui>_> local_50;
  _Head_base<0UL,_gui::Theme_*,_false> local_48;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  CVar1 = this->cursorState_;
  local_a1 = acrossVertical;
  if (CVar1 == pasteArea) {
    this_00 = &this->copySubBoard_;
  }
  else {
    if (CVar1 != pickTile) {
      if ((CVar1 == empty) && ((this->cursorCoords_).second == true)) {
        pVar13 = Board::getHighlightedBounds(this->board_);
        iVar6 = pVar13.first.x;
        iVar9 = pVar13.second.x;
        if (iVar9 < iVar6) {
          local_a0 = (Vector2i)((ulong)local_a0 & 0xffffffffffffff00);
          makeCommand<commands::FlipTiles,Board&,bool&,bool>
                    ((Editor *)local_78,(Board *)this,(bool *)this->board_,&local_a1);
          commands::FlipTiles::pushBackTile
                    ((FlipTiles *)local_78._0_8_,&(this->cursorCoords_).first);
          uVar2 = local_78._0_8_;
          local_78._0_8_ = (__uniq_ptr_impl<Command,_std::default_delete<Command>_>)0x0;
          uVar3 = local_78._0_8_;
          local_78._0_4_ = (undefined4)uVar2;
          local_78._4_4_ = SUB84(uVar2,4);
          local_a0.x = local_78._0_4_;
          local_a0.y = local_78._4_4_;
          local_78._0_8_ = uVar3;
          executeCommand(this,(unique_ptr<Command,_std::default_delete<Command>_> *)&local_a0);
          tVar8.super__Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>.
          super__Head_base<0UL,_Command_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)
               (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)local_78._0_8_;
          if (local_a0 != (Vector2i)0x0) {
            (**(code **)(*(long *)local_a0 + 8))();
            tVar8.super__Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>.
            super__Head_base<0UL,_Command_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)
                 (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)local_78._0_8_;
          }
        }
        else {
          local_78[0] = 1;
          makeCommand<commands::FlipTiles,Board&,bool&,bool>
                    ((Editor *)local_98,(Board *)this,(bool *)this->board_,&local_a1);
          local_58 = this->board_;
          local_38._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((ulong)pVar13.first >> 0x20);
          local_40 = (element_type *)((ulong)pVar13.second >> 0x20);
          local_98._12_4_ = pVar13.second.y >> 5;
          local_98._8_4_ = iVar6 >> 5;
          local_98._20_4_ = iVar9 >> 5;
          uVar5 = pVar13.first.y >> 5;
          local_78._24_8_ = this;
          while (uVar2 = local_98._0_8_, (int)uVar5 <= (int)local_98._12_4_) {
            local_50._M_t.super__Tuple_impl<0UL,_gui::Gui_*,_std::default_delete<gui::Gui>_>.
            super__Head_base<0UL,_gui::Gui_*,_false>._M_head_impl =
                 (tuple<gui::Gui_*,_std::default_delete<gui::Gui>_>)
                 ((ulong)(uVar5 | 0x80000000) << 0x20);
            local_98._28_4_ = uVar5 << 5;
            uVar7 = local_98._8_4_;
            local_98._16_4_ = uVar5;
            while ((int)uVar7 <= (int)local_98._20_4_) {
              local_48._M_head_impl =
                   (Theme *)Board::accessChunk(local_58,(ulong)(uVar7 | 0x80000000) |
                                                        (ulong)local_50._M_t.
                                                                                                                              
                                                  super__Tuple_impl<0UL,_gui::Gui_*,_std::default_delete<gui::Gui>_>
                                                  .super__Head_base<0UL,_gui::Gui_*,_false>.
                                                  _M_head_impl);
              uVar11 = 0;
              local_98._24_4_ = uVar7;
              while (uVar5 = (uint)uVar11, uVar5 != 0x400) {
                uVar10 = uVar5 & 0x1f | uVar7 << 5;
                if ((iVar6 <= (int)uVar10) && ((int)uVar10 <= iVar9)) {
                  iVar12 = (int)(uVar11 >> 5) + local_98._28_4_;
                  if (((int)local_38._M_pi <= iVar12) && (iVar12 <= (int)local_40)) {
                    Chunk::accessTile((Tile *)local_78,(Chunk *)local_48._M_head_impl,uVar5);
                    bVar4 = Tile::getHighlight((Tile *)local_78);
                    if (bVar4) {
                      local_a0.y = iVar12;
                      local_a0.x = uVar10;
                      commands::FlipTiles::pushBackTile((FlipTiles *)local_98._0_8_,&local_a0);
                    }
                  }
                }
                uVar11 = (ulong)(uVar5 + 1);
              }
              uVar7 = local_98._24_4_ + 1;
            }
            uVar5 = local_98._16_4_ + 1;
          }
          local_98._0_8_ = (FlipTiles *)0x0;
          local_78._0_8_ = uVar2;
          executeCommand((Editor *)local_78._24_8_,
                         (unique_ptr<Command,_std::default_delete<Command>_> *)local_78);
          tVar8.super__Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>.
          super__Head_base<0UL,_Command_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)
               (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)local_98._0_8_;
          if ((__uniq_ptr_impl<Command,_std::default_delete<Command>_>)local_78._0_8_ !=
              (__uniq_ptr_impl<Command,_std::default_delete<Command>_>)0x0) {
            (**(code **)(*(_func_int **)local_78._0_8_ + 8))();
            tVar8.super__Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>.
            super__Head_base<0UL,_Command_*,_false>._M_head_impl =
                 (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)
                 (_Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>)local_98._0_8_;
          }
        }
        if (tVar8.super__Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>.
            super__Head_base<0UL,_Command_*,_false>._M_head_impl !=
            (_Head_base<0UL,_Command_*,_false>)0x0) {
          (**(code **)(*(long *)tVar8.
                                super__Tuple_impl<0UL,_Command_*,_std::default_delete<Command>_>.
                                super__Head_base<0UL,_Command_*,_false>._M_head_impl + 8))();
        }
      }
      return;
    }
    this_00 = &this->tileSubBoard_;
  }
  SubBoard::flip(this_00,acrossVertical);
  return;
}

Assistant:

void Editor::flipTile(bool acrossVertical) {
    if (cursorState_ == CursorState::empty) {
        if (!cursorCoords_.second) {
            return;
        }
        auto bounds = board_.getHighlightedBounds();
        if (bounds.first.x > bounds.second.x) {
            // Not flipping a selection.
            auto command = makeCommand<commands::FlipTiles>(board_, acrossVertical, false);
            command->pushBackTile(cursorCoords_.first);
            executeCommand(std::move(command));
        } else {
            // Flipping a selection.
            auto command = makeCommand<commands::FlipTiles>(board_, acrossVertical, true);
            forEachTile(board_, bounds.first, bounds.second, [&command](Chunk& chunk, int i, int x, int y) {
                Tile tile = chunk.accessTile(i);
                if (tile.getHighlight()) {
                    command->pushBackTile({x, y});
                }
            });
            executeCommand(std::move(command));
        }
    } else if (cursorState_ == CursorState::pickTile) {
        tileSubBoard_.flip(acrossVertical);
    } else if (cursorState_ == CursorState::pasteArea) {
        copySubBoard_.flip(acrossVertical);
    }
}